

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Console.cpp
# Opt level: O1

double __thiscall Console::log(Console *this,double __x)

{
  iterator __position;
  tm *ptVar1;
  ostream *poVar2;
  ulong uVar3;
  double dVar4;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  _Put_time<char> __f;
  time_t date_c;
  Log entry;
  ostringstream stream;
  long local_210;
  undefined1 local_208 [8];
  _Alloc_hider local_200;
  size_type local_1f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f0;
  _Alloc_hider local_1e0;
  size_type local_1d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d0;
  undefined1 *local_1c0 [2];
  undefined1 local_1b0 [16];
  ostringstream local_1a0 [112];
  ios_base local_130 [264];
  
  local_208 = (undefined1  [8])0x0;
  local_1f8 = 0;
  local_1f0._M_local_buf[0] = '\0';
  local_1d8 = 0;
  local_1d0._M_local_buf[0] = '\0';
  local_200._M_p = (pointer)&local_1f0;
  local_1e0._M_p = (pointer)&local_1d0;
  local_208 = (undefined1  [8])std::chrono::_V2::system_clock::now();
  std::__cxx11::string::_M_assign((string *)&local_1e0);
  local_210 = (long)local_208 / 1000000000;
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  ptVar1 = localtime(&local_210);
  __f._M_fmt = "%H:%M:%S";
  __f._M_tmb = (tm *)ptVar1;
  std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)local_1a0,__f);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_200,(string *)local_1c0);
  if (local_1c0[0] != local_1b0) {
    operator_delete(local_1c0[0]);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\x1b[1;34m[",8);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_200._M_p,local_1f8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"]\x1b[0m ",6);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_1e0._M_p,local_1d8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::vector<Log,_std::allocator<Log>_>::push_back(&this->history,(value_type *)local_208);
  __position._M_current =
       (this->history).super__Vector_base<Log,_std::allocator<Log>_>._M_impl.super__Vector_impl_data
       ._M_start;
  uVar3 = ((long)(this->history).super__Vector_base<Log,_std::allocator<Log>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)__position._M_current >> 3) *
          -0x71c71c71c71c71c7;
  if ((ulong)(long)this->history_size <= uVar3 && uVar3 - (long)this->history_size != 0) {
    std::vector<Log,_std::allocator<Log>_>::_M_erase(&this->history,__position);
  }
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  dVar4 = (double)std::ios_base::~ios_base(local_130);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_p != &local_1d0) {
    operator_delete(local_1e0._M_p);
    dVar4 = extraout_XMM0_Qa;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_p != &local_1f0) {
    operator_delete(local_200._M_p);
    dVar4 = extraout_XMM0_Qa_00;
  }
  return dVar4;
}

Assistant:

void Console::log(std::string message) {
    Log entry;
    entry.date = std::chrono::system_clock::now();
    entry.message = message;
    
    std::time_t date_c = std::chrono::system_clock::to_time_t(entry.date);
    
    std::ostringstream stream;
    stream << std::put_time(std::localtime(&date_c), "%H:%M:%S");
    
    entry.formatted_date = stream.str();

    std::cout << "\033[1;34m[" << entry.formatted_date << "]\033[0m " << entry.message << std::endl;
    
    history.push_back(entry);
    
    if (history.size() > history_size) {
        history.erase(history.begin());
    }
}